

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O3

bool __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *smoothed_static_parameters)

{
  _Vector_impl_data *p_Var1;
  pointer pSVar2;
  long lVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong *puVar11;
  double *pdVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  pointer pvVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  size_type sVar21;
  long lVar22;
  long lVar23;
  pointer pdVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  pointer pvVar29;
  pointer *ppdVar30;
  double *pdVar31;
  uint uVar32;
  size_type sVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  size_type __n;
  long lVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  SymmetricMatrix precision;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  wuw;
  vector<double,_std::allocator<double>_> wum;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> vseq;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mseq;
  vector<double,_std::allocator<double>_> cc;
  vector<double,_std::allocator<double>_> gg;
  ulong local_238;
  double local_220;
  ulong local_218;
  long local_1f0;
  uint local_1d4;
  long local_1b8;
  Row local_1b0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  undefined1 local_178 [16];
  int local_168;
  ulong local_138;
  ulong local_130;
  long local_128;
  long local_120;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_118;
  vector<double,_std::allocator<double>_> local_100;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  long local_90;
  vector<double,_std::allocator<double>_> local_88;
  vector<bool,_std::allocator<bool>_> local_70;
  vector<double,_std::allocator<double>_> local_48;
  
  if (this->is_valid_ == true) {
    pvVar17 = (mean_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar29 = (mean_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar17 != pvVar29) {
      if (smoothed_static_parameters ==
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0x0) {
        return false;
      }
      lVar19 = ((long)pvVar29 - (long)pvVar17 >> 3) * -0x5555555555555555;
      pSVar2 = (covariance_matrices->
               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(covariance_matrices->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
      if (lVar19 - ((long)uVar10 >> 6) != 0) {
        return false;
      }
      local_138 = ((long)(this->window_coefficients_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->window_coefficients_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_190 = (ulong)(uint)this->num_order_;
      uVar35 = this->num_order_ + 1;
      uVar32 = uVar35 * (int)local_138;
      uVar18 = (uint)lVar19;
      if (0 < (int)uVar18) {
        if (uVar32 != (uint)((ulong)((long)(pvVar17->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar17->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data._M_start) >> 3)) {
          return false;
        }
        ppdVar30 = &pvVar17[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        uVar25 = 1;
        do {
          uVar34 = uVar25;
          if ((uVar18 & 0x7fffffff) == uVar34) break;
          pdVar24 = *ppdVar30;
          p_Var1 = (_Vector_impl_data *)(ppdVar30 + -1);
          ppdVar30 = ppdVar30 + 3;
          uVar25 = uVar34 + 1;
        } while (uVar32 == (uint)((ulong)((long)pdVar24 - (long)p_Var1->_M_start) >> 3));
        if (uVar34 < (uVar18 & 0x7fffffff)) {
          return false;
        }
      }
      uVar8 = (uint)(uVar10 >> 6);
      if ((int)uVar8 < 1) {
LAB_0010736a:
        sVar33 = (size_type)(int)uVar18;
        local_178[0] = 1;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_70,sVar33,(bool *)local_178,(allocator_type *)&local_d0);
        if ((0 < (int)uVar18) && (this->use_magic_number_ != false)) {
          dVar40 = this->magic_number_;
          pvVar17 = (mean_vectors->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = 0;
          do {
            pdVar12 = (pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if ((dVar40 == *pdVar12) && (!NAN(dVar40) && !NAN(*pdVar12))) {
              bVar4 = (byte)uVar10 & 0x3f;
              local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6 & 0x3ffffff] =
                   local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [uVar10 >> 6 & 0x3ffffff] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            uVar10 = uVar10 + 1;
            pvVar17 = pvVar17 + 1;
          } while ((uVar18 & 0x7fffffff) != uVar10);
        }
        uVar10 = 0;
        if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset != 0 ||
            local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p !=
            local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p) {
          uVar25 = 0;
          puVar11 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          do {
            uVar10 = uVar10 + ((*puVar11 >> (uVar25 & 0x3f) & 1) != 0);
            iVar9 = (int)uVar25;
            puVar11 = puVar11 + (iVar9 == 0x3f);
            uVar25 = (ulong)(iVar9 + 1);
            if (iVar9 == 0x3f) {
              uVar25 = 0;
            }
          } while ((uint)uVar25 !=
                   local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset ||
                   puVar11 !=
                   local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
        }
        local_180 = (ulong)(uint)this->max_half_window_width_;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_178,(long)(int)uVar32,
                   (allocator_type *)&local_e8);
        uVar8 = (uint)uVar10;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_d0,(long)(int)uVar8,(value_type *)local_178,(allocator_type *)&local_100);
        if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_178._0_8_);
        }
        SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_178,uVar32);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                  (&local_e8,(long)(int)uVar8,(value_type *)local_178,(allocator_type *)&local_100);
        uVar36 = uVar35 * uVar8;
        SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_178);
        __n = (size_type)(int)uVar36;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_100,__n,(allocator_type *)local_178);
        iVar9 = ((int)local_180 * 2 + 1) * uVar35;
        sVar21 = (size_type)iVar9;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_178,sVar21,
                   (allocator_type *)&local_48);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_118,__n,(value_type *)local_178,(allocator_type *)&local_88);
        if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_178._0_8_);
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_48,__n,(allocator_type *)local_178);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_88,__n,(allocator_type *)local_178);
        if (((long)(smoothed_static_parameters->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(smoothed_static_parameters->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - sVar33
            != 0) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize(smoothed_static_parameters,sVar33);
        }
        bVar38 = true;
        if (0 < (int)uVar18) {
          uVar25 = (ulong)(uVar18 & 0x7fffffff);
          lVar19 = 0;
          do {
            pvVar17 = (smoothed_static_parameters->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (*(long *)((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar19 + 8) -
                *(long *)((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar19) >> 3 != (long)(int)uVar35
               ) {
              std::vector<double,_std::allocator<double>_>::resize
                        ((vector<double,_std::allocator<double>_> *)
                         ((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar19),(long)(int)uVar35);
            }
            lVar19 = lVar19 + 0x18;
            uVar25 = uVar25 - 1;
          } while (uVar25 != 0);
          if (0 < (int)uVar18) {
            uVar25 = 0;
            bVar38 = false;
            iVar20 = 0;
            do {
              if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [uVar25 >> 6 & 0x3ffffff] >> (uVar25 & 0x3f) & 1) != 0) {
                SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_178,0);
                bVar7 = SymmetricMatrix::Invert
                                  ((covariance_matrices->
                                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar25,
                                   (SymmetricMatrix *)local_178);
                if (!bVar7) {
                  SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_178);
                  goto LAB_0010821f;
                }
                if (0 < (int)uVar32) {
                  lVar19 = *(long *)&(mean_vectors->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar25].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  lVar37 = (long)iVar20;
                  uVar34 = 0;
                  do {
                    iVar26 = (int)uVar34;
                    iVar15 = (int)((long)((ulong)(uint)(iVar26 >> 0x1f) << 0x20 |
                                         uVar34 & 0xffffffff) / (long)(int)uVar35);
                    pvVar17 = (this->window_coefficients_).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar23 = *(long *)&pvVar17[iVar15].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data;
                    iVar15 = (int)((ulong)((long)*(pointer *)
                                                  ((long)&pvVar17[iVar15].
                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar23) >>
                                  3);
                    if (iVar15 < 0) {
LAB_001077d1:
                      local_1b0._vptr_Row = (_func_int **)&PTR__Row_00118b90;
                      local_1b0.matrix_ = (SymmetricMatrix *)local_178;
                      local_1b0.row_ = iVar26;
                      pdVar12 = SymmetricMatrix::Row::operator[](&local_1b0,iVar26);
                      dVar40 = *pdVar12;
                      local_d0.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar37].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar34] =
                           *(double *)(lVar19 + uVar34 * 8) * dVar40;
                      local_1b0.matrix_ =
                           local_e8.
                           super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar37;
                      local_1b0._vptr_Row = (_func_int **)&PTR__Row_00118b90;
                      local_1b0.row_ = iVar26;
                      pdVar12 = SymmetricMatrix::Row::operator[](&local_1b0,iVar26);
                      *pdVar12 = dVar40;
                      if (uVar34 != 0) {
                        uVar28 = 0;
                        do {
                          local_1b0._vptr_Row = (_func_int **)&PTR__Row_00118b90;
                          local_1b0.matrix_ = (SymmetricMatrix *)local_178;
                          local_1b0.row_ = iVar26;
                          pdVar12 = SymmetricMatrix::Row::operator[](&local_1b0,(int)uVar28);
                          dVar40 = *pdVar12;
                          if ((dVar40 != 0.0) || (NAN(dVar40))) {
                            pdVar24 = local_d0.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start;
                            pdVar24[uVar34] =
                                 *(double *)(lVar19 + uVar28 * 8) * dVar40 + pdVar24[uVar34];
                            pdVar24[uVar28] =
                                 *(double *)(lVar19 + uVar34 * 8) * dVar40 + pdVar24[uVar28];
                            local_1b0.matrix_ =
                                 local_e8.
                                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar37;
                            local_1b0._vptr_Row = (_func_int **)&PTR__Row_00118b90;
                            local_1b0.row_ = iVar26;
                            pdVar12 = SymmetricMatrix::Row::operator[](&local_1b0,(int)uVar28);
                            *pdVar12 = dVar40;
                          }
                          uVar28 = uVar28 + 1;
                        } while (uVar34 != uVar28);
                      }
                    }
                    else {
                      uVar14 = (iVar15 - (iVar15 + -1 >> 0x1f)) + -1 >> 1;
                      iVar15 = -uVar14;
                      lVar22 = (long)iVar15;
                      bVar38 = false;
                      do {
                        lVar22 = lVar22 + 1;
                        while (((lVar27 = lVar37 + lVar22 + -1, -1 < lVar27 && (lVar27 < (int)uVar8)
                                ) && (((dVar40 = *(double *)
                                                  (lVar23 + (ulong)uVar14 * 8 + -8 + lVar22 * 8),
                                       dVar40 == 0.0 && (!NAN(dVar40))) ||
                                      ((uVar28 = (uVar25 + lVar22) - 1, uVar18 <= (uint)uVar28 ||
                                       ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl
                                         .super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                         ._M_p[uVar28 >> 6 & 0x3ffffff] >> (uVar28 & 0x3f) & 1) != 0
                                       ))))))) {
                          lVar22 = lVar22 + 1;
                          if ((int)lVar22 + iVar15 == 2) {
                            if (bVar38) goto LAB_00107957;
                            goto LAB_001077d1;
                          }
                        }
                        bVar38 = true;
                      } while (iVar15 + (int)lVar22 != 1);
                    }
LAB_00107957:
                    uVar34 = uVar34 + 1;
                  } while (uVar34 != uVar32);
                }
                iVar20 = iVar20 + 1;
                SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_178);
              }
              uVar25 = uVar25 + 1;
              bVar38 = (uVar18 & 0x7fffffff) <= uVar25;
            } while (uVar25 != (uVar18 & 0x7fffffff));
          }
        }
        uVar32 = (int)local_180 * 2;
        local_198 = (ulong)uVar32;
        if (0 < (int)uVar8) {
          local_188 = (ulong)uVar35;
          uVar10 = uVar10 & 0x7fffffff;
          local_90 = (long)(int)uVar32;
          uVar25 = local_138 & 0x7fffffff;
          lVar19 = 1;
          local_238 = 0;
          local_130 = uVar10;
          do {
            if (-1 < (int)local_190) {
              local_b8 = (ulong)(uVar35 * (int)local_238);
              uVar34 = 0;
              uVar28 = 0;
              local_128 = lVar19;
              do {
                local_120 = local_b8 + uVar28;
                local_1d4 = (uint)uVar34;
                local_218 = 0;
                local_b0 = uVar34;
                do {
                  if (0 < (int)local_138) {
                    pvVar17 = (this->window_coefficients_).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar13 = (ulong)(uint)this->max_half_window_width_;
                    uVar34 = 0;
                    do {
                      iVar20 = (int)uVar13;
                      if (-1 < iVar20) {
                        local_1b8 = *(long *)&pvVar17[uVar34].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data;
                        iVar15 = (int)((ulong)((long)*(pointer *)
                                                      ((long)&pvVar17[uVar34].
                                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - local_1b8)
                                      >> 3);
                        iVar15 = (iVar15 - (iVar15 + -1 >> 0x1f)) + -1 >> 1;
                        lVar22 = (long)iVar15;
                        local_98 = local_1b8 + lVar22 * 8;
                        local_1f0 = (long)iVar20;
                        local_a0 = uVar34 * local_188;
                        iVar26 = (int)local_a0;
                        lVar23 = (long)-iVar15;
                        local_1b8 = lVar22 * 8 + local_1f0 * 8 + local_1b8;
                        lVar37 = (long)-iVar20;
                        local_a8 = uVar34;
                        do {
                          lVar19 = lVar37 + local_238;
                          if ((uint)lVar19 < uVar8) {
                            if (((local_218 == 0) && (lVar23 <= lVar37)) && (lVar37 <= lVar22)) {
                              dVar40 = *(double *)(local_98 + lVar37 * -8);
                              if ((dVar40 != 0.0) || (NAN(dVar40))) {
                                local_100.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_120] =
                                     dVar40 * local_d0.
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start
                                              [local_a0 + uVar28] +
                                     local_100.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start[local_120];
                              }
                            }
                            local_220 = 0.0;
                            lVar27 = 8;
                            uVar34 = uVar28 & 0xffffffff;
                            uVar10 = uVar25;
                            do {
                              local_178._8_8_ =
                                   local_e8.
                                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar19;
                              local_178._0_8_ = &PTR__Row_00118b90;
                              local_168 = (int)uVar34;
                              pdVar12 = SymmetricMatrix::Row::operator[]
                                                  ((Row *)local_178,(int)local_218 + iVar26);
                              pvVar17 = (this->window_coefficients_).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              lVar3 = *(long *)((long)pvVar17 + lVar27 + -8);
                              iVar20 = (int)((ulong)(*(long *)((long)&(pvVar17->
                                                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar27) -
                                                  lVar3) >> 3);
                              iVar20 = (iVar20 - (iVar20 + -1 >> 0x1f)) + -1 >> 1;
                              if ((-iVar20 <= lVar37) && (lVar37 <= iVar20)) {
                                dVar40 = *(double *)(lVar3 + (long)iVar20 * 8 + lVar37 * -8);
                                if ((dVar40 != 0.0) || (NAN(dVar40))) {
                                  dVar41 = *pdVar12;
                                  if ((dVar41 != 0.0) || (NAN(dVar41))) {
                                    local_220 = local_220 + dVar40 * dVar41;
                                  }
                                }
                              }
                              uVar34 = (ulong)((int)uVar34 + uVar35);
                              lVar27 = lVar27 + 0x18;
                              uVar10 = uVar10 - 1;
                            } while (uVar10 != 0);
                            if (local_220 != 0.0 && -1 < (int)local_180) {
                              lVar19 = 0;
                              uVar32 = local_1d4;
                              do {
                                if ((lVar23 <= local_1f0 + lVar19) && (local_1f0 + lVar19 <= lVar22)
                                   ) {
                                  dVar40 = *(double *)(local_1b8 + lVar19 * 8);
                                  if (((dVar40 != 0.0) || (NAN(dVar40))) && (-1 < (int)uVar32)) {
                                    pdVar24 = local_118.
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[local_120].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start;
                                    pdVar24[uVar32] = dVar40 * local_220 + pdVar24[uVar32];
                                  }
                                }
                                if (local_90 <= lVar19) break;
                                uVar10 = local_128 + lVar19;
                                lVar19 = lVar19 + 1;
                                uVar32 = uVar32 + uVar35;
                              } while (uVar10 < local_130);
                            }
                          }
                          uVar13 = (ulong)this->max_half_window_width_;
                          local_1b8 = local_1b8 + -8;
                          local_1f0 = local_1f0 + -1;
                          bVar7 = lVar37 < (long)uVar13;
                          uVar10 = local_130;
                          lVar19 = local_128;
                          uVar34 = local_a8;
                          lVar37 = lVar37 + 1;
                        } while (bVar7);
                      }
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar25);
                  }
                  local_218 = local_218 + 1;
                  local_1d4 = local_1d4 + 1;
                } while (local_218 != local_188);
                uVar28 = uVar28 + 1;
                uVar34 = (ulong)((int)local_b0 - 1);
              } while (uVar28 != local_188);
            }
            local_238 = local_238 + 1;
            lVar19 = lVar19 + 1;
          } while (local_238 != uVar10);
        }
        if (0 < (int)uVar36) {
          pvVar17 = local_118.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + -1;
          uVar10 = 0;
          do {
            pdVar12 = local_118.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar40 = *pdVar12;
            if (uVar10 != 0 && 1 < iVar9) {
              pvVar29 = pvVar17;
              uVar25 = 1;
              do {
                pdVar31 = (pvVar29->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                dVar41 = pdVar31[uVar25];
                dVar40 = dVar40 - dVar41 * dVar41 * *pdVar31;
                *pdVar12 = dVar40;
                if ((long)sVar21 <= (long)(uVar25 + 1)) break;
                pvVar29 = pvVar29 + -1;
                bVar7 = uVar25 < uVar10;
                uVar25 = uVar25 + 1;
              } while (bVar7);
            }
            if (1 < iVar9) {
              lVar19 = 3;
              lVar37 = 0x10;
              uVar25 = 1;
              do {
                uVar34 = uVar25 + 1;
                dVar41 = pdVar12[uVar25];
                if ((uVar10 != 0) && ((long)uVar34 < (long)sVar21)) {
                  uVar28 = 1;
                  pvVar29 = pvVar17;
                  do {
                    pdVar31 = (pvVar29->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                              .super__Vector_impl_data._M_start;
                    dVar41 = dVar41 - *(double *)((long)pdVar31 + lVar37 + -8 + uVar28 * 8) *
                                      pdVar31[uVar28] * *pdVar31;
                    pdVar12[uVar25] = dVar41;
                    if (uVar10 <= uVar28) break;
                    lVar23 = lVar19 + uVar28;
                    uVar28 = uVar28 + 1;
                    pvVar29 = pvVar29 + -1;
                  } while (lVar23 + -1 < (long)sVar21);
                }
                pdVar12[uVar25] = dVar41 * (1.0 / dVar40);
                lVar19 = lVar19 + 1;
                lVar37 = lVar37 + 8;
                uVar25 = uVar34;
              } while (uVar34 != ((uint)local_198 | 1) * uVar35);
            }
            uVar10 = uVar10 + 1;
            pvVar17 = pvVar17 + 1;
          } while (uVar10 != uVar36);
          if (0 < (int)uVar36) {
            pdVar12 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + -1;
            pvVar17 = local_118.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -1;
            uVar10 = 0;
            do {
              dVar40 = local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
              local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = dVar40;
              if (uVar10 != 0 && 1 < iVar9) {
                pvVar29 = pvVar17;
                pdVar31 = pdVar12;
                uVar25 = 1;
                do {
                  dVar40 = dVar40 - (pvVar29->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar25] * *pdVar31;
                  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] = dVar40;
                  if ((long)sVar21 <= (long)(uVar25 + 1)) break;
                  pdVar31 = pdVar31 + -1;
                  pvVar29 = pvVar29 + -1;
                  bVar7 = uVar25 < uVar10;
                  uVar25 = uVar25 + 1;
                } while (bVar7);
              }
              uVar10 = uVar10 + 1;
              pdVar12 = pdVar12 + 1;
              pvVar17 = pvVar17 + 1;
            } while (uVar10 != uVar36);
            if (0 < (int)uVar36) {
              pdVar24 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + __n;
              sVar33 = __n;
              do {
                sVar21 = sVar33 - 1;
                pdVar12 = local_118.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar21].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                dVar40 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar33 - 1] / *pdVar12;
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar33 - 1] = dVar40;
                if (1 < iVar9) {
                  lVar19 = 0;
                  do {
                    if ((long)__n <= (long)(sVar33 + lVar19)) break;
                    dVar40 = dVar40 - pdVar12[lVar19 + 1] * pdVar24[lVar19];
                    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar21] = dVar40;
                    lVar19 = lVar19 + 1;
                  } while ((ulong)(((uint)local_198 + 1) * uVar35) - 1 != lVar19);
                }
                pdVar24 = pdVar24 + -1;
                bVar7 = 1 < (long)sVar33;
                sVar33 = sVar21;
              } while (bVar7);
            }
          }
        }
        auVar6 = _DAT_00112b80;
        auVar5 = _DAT_00112b70;
        if (0 < (int)uVar18) {
          pvVar17 = (smoothed_static_parameters->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = (ulong)uVar35;
          lVar19 = uVar10 - 1;
          auVar39._8_4_ = (int)lVar19;
          auVar39._0_8_ = lVar19;
          auVar39._12_4_ = (int)((ulong)lVar19 >> 0x20);
          uVar25 = 0;
          auVar39 = auVar39 ^ _DAT_00112b80;
          iVar9 = 0;
          do {
            lVar19 = *(long *)&pvVar17[uVar25].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [uVar25 >> 6 & 0x3ffffff] >> (uVar25 & 0x3f) & 1) == 0) {
              if (-1 < (int)local_190) {
                dVar40 = this->magic_number_;
                uVar34 = 0;
                auVar42 = auVar5;
                do {
                  auVar43 = auVar42 ^ auVar6;
                  if ((bool)(~(auVar39._4_4_ < auVar43._4_4_ ||
                              auVar39._0_4_ < auVar43._0_4_ && auVar43._4_4_ == auVar39._4_4_) & 1))
                  {
                    *(double *)(lVar19 + uVar34) = dVar40;
                  }
                  if (auVar43._12_4_ <= auVar39._12_4_ &&
                      (auVar43._8_4_ <= auVar39._8_4_ || auVar43._12_4_ != auVar39._12_4_)) {
                    *(double *)(lVar19 + 8 + uVar34) = dVar40;
                  }
                  lVar37 = auVar42._8_8_;
                  auVar42._0_8_ = auVar42._0_8_ + 2;
                  auVar42._8_8_ = lVar37 + 2;
                  uVar34 = uVar34 + 0x10;
                } while ((uVar10 * 8 + 8 & 0xfffffffffffffff0) != uVar34);
              }
            }
            else if (-1 < (int)local_190) {
              uVar34 = 0;
              do {
                *(double *)(lVar19 + uVar34 * 8) =
                     local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)iVar9 + uVar34];
                uVar34 = uVar34 + 1;
              } while (uVar10 != uVar34);
              iVar9 = iVar9 + (int)uVar34;
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != (uVar18 & 0x7fffffff));
        }
LAB_0010821f:
        if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_118);
        if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
                  (&local_e8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_d0);
        if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
          operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          return bVar38;
        }
        return bVar38;
      }
      if (pSVar2->num_dimension_ == uVar32) {
        uVar25 = (ulong)(uVar8 & 0x7fffffff);
        piVar16 = &pSVar2[1].num_dimension_;
        uVar10 = 1;
        do {
          uVar34 = uVar10;
          if (uVar25 == uVar34) break;
          uVar8 = *piVar16;
          piVar16 = piVar16 + 0x10;
          uVar10 = uVar34 + 1;
        } while (uVar8 == uVar32);
        if (uVar25 <= uVar34) goto LAB_0010736a;
      }
    }
  }
  return false;
}

Assistant:

bool NonrecursiveMaximumLikelihoodParameterGeneration::Run(
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<std::vector<double> >* smoothed_static_parameters) const {
  // Check inputs.
  if (!is_valid_ || mean_vectors.empty() ||
      mean_vectors.size() != covariance_matrices.size() ||
      NULL == smoothed_static_parameters) {
    return false;
  }

  const int num_window(static_cast<int>(window_coefficients_.size()));
  const int static_size(num_order_ + 1);
  const int length(static_size * num_window);
  if (!CheckSize(mean_vectors, length) ||
      !CheckSize(covariance_matrices, length)) {
    return false;
  }

  // Store positions that contain a magic number.
  const int sequence_length(static_cast<int>(mean_vectors.size()));
  std::vector<bool> is_continuous(sequence_length, true);
  if (use_magic_number_) {
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      if (magic_number_ == mean_vectors[absolute_t][0]) {
        is_continuous[absolute_t] = false;
      }
    }
  }
  const int continuous_length(static_cast<int>(
      std::count(is_continuous.begin(), is_continuous.end(), true)));

  // Prepare memories.
  const int max_window_width(2 * max_half_window_width_ + 1);
  const int wuw_height(static_size * continuous_length);
  const int wuw_width(static_size * max_window_width);
  std::vector<std::vector<double> > mseq(continuous_length,
                                         std::vector<double>(length));
  std::vector<SymmetricMatrix> vseq(continuous_length, SymmetricMatrix(length));
  std::vector<double> wum(wuw_height);
  std::vector<std::vector<double> > wuw(wuw_height,
                                        std::vector<double>(wuw_width));
  std::vector<double> gg(wuw_height);
  std::vector<double> cc(wuw_height);
  {
    if (smoothed_static_parameters->size() !=
        static_cast<std::size_t>(sequence_length)) {
      smoothed_static_parameters->resize(sequence_length);
    }
    for (int t(0); t < sequence_length; ++t) {
      if ((*smoothed_static_parameters)[t].size() !=
          static_cast<std::size_t>(static_size)) {
        (*smoothed_static_parameters)[t].resize(static_size);
      }
    }
  }

  // Set mseq and vseq.
  for (int absolute_t(0), t(0); absolute_t < sequence_length; ++absolute_t) {
    if (!is_continuous[absolute_t]) continue;

    SymmetricMatrix precision;
    if (!covariance_matrices[absolute_t].Invert(&precision)) {
      return false;
    }
    const double* mean(&(mean_vectors[absolute_t][0]));

    for (int k(0); k < length; ++k) {
      // Check boundary.
      bool is_boundary(false);
      {
        const int d(k / static_size);
        const int half_window_width(
            (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
        for (int j(-half_window_width); j <= half_window_width; ++j) {
          const int biased_t(t + j);
          const int biased_absolute_t(absolute_t + j);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          if (biased_t < 0 || continuous_length <= biased_t ||
              (0.0 != window_coefficients[j] && 0 <= biased_absolute_t &&
               biased_absolute_t < sequence_length &&
               !is_continuous[biased_absolute_t])) {
            is_boundary = true;
          }
        }
      }

      if (!is_boundary) {
        const double p(precision[k][k]);
        mseq[t][k] = p * mean[k];
        vseq[t][k][k] = p;
        for (int l(0); l < k; ++l) {
          const double q(precision[k][l]);
          if (0.0 != q) {
            mseq[t][k] += q * mean[l];
            mseq[t][l] += q * mean[k];
            vseq[t][k][l] = q;
          }
        }
      }
    }

    // Update counter.
    ++t;
  }

  // Calculate WUM and WUW.
  for (int t(0); t < continuous_length; ++t) {
    for (int m(0); m < static_size; ++m) {
      const int tau(static_size * t + m);
      for (int n(0); n < static_size; ++n) {
        for (int d(0); d < num_window; ++d) {
          const int half_window_width(
              (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          for (int j(-max_half_window_width_); j <= max_half_window_width_;
               ++j) {
            const int biased_t(t + j);
            if (biased_t < 0 || continuous_length <= biased_t) continue;

            // Accumulate W'U^{-1}M.
            if (0 == n &&
                CheckRange(j, half_window_width, window_coefficients, true)) {
              wum[tau] += (window_coefficients[-j] *
                           mseq[biased_t][d * static_size + m]);
            }

            // Accumulate W'U^{-1}W.
            double wu(0.0);
            for (int c(0); c < num_window; ++c) {
              const double u(
                  vseq[biased_t][static_size * c + m][static_size * d + n]);
              const int half_window_width2(
                  (static_cast<int>(window_coefficients_[c].size()) - 1) / 2);
              const double* window_coefficients2(
                  &(window_coefficients_[c][half_window_width2]));
              if (CheckRange(j, half_window_width2, window_coefficients2,
                             true) &&
                  0.0 != u) {
                wu += window_coefficients2[-j] * u;
              }
            }
            if (0.0 != wu) {
              for (int k(0); k < max_window_width && t + k < continuous_length;
                   ++k) {
                const int index(static_size * k + n - m);
                if (CheckRange(k - j, half_window_width, window_coefficients,
                               false) &&
                    0 <= index) {
                  wuw[tau][index] += wu * window_coefficients[k - j];
                }
              }
            }
          }
        }
      }
    }
  }

  // Compute Cholesky factor.
  for (int t(0); t < wuw_height; ++t) {
    for (int i(1); i < wuw_width && i <= t; ++i) {
      wuw[t][0] -= wuw[t - i][i] * wuw[t - i][i] * wuw[t - i][0];
    }

    const double z(1.0 / wuw[t][0]);
    for (int i(1); i < wuw_width; ++i) {
      for (int j(1); i + j < wuw_width && j <= t; ++j) {
        wuw[t][i] -= wuw[t - j][j] * wuw[t - j][i + j] * wuw[t - j][0];
      }
      wuw[t][i] *= z;
    }
  }

  // Forward substitution to solve a set of linear equations.
  {
    const double* r(&(wum[0]));
    double* g(&(gg[0]));
    for (int t(0); t < wuw_height; ++t) {
      g[t] = r[t];
      for (int i(1); i < wuw_width && i <= t; ++i) {
        g[t] -= wuw[t - i][i] * g[t - i];
      }
    }
  }

  // Backward substitution to solve a set of linear equations.
  {
    const double* g(&(gg[0]));
    double* c(&(cc[0]));
    for (int t(wuw_height - 1); 0 <= t; --t) {
      c[t] = g[t] / wuw[t][0];
      for (int i(1); i < wuw_width && t + i < wuw_height; ++i) {
        c[t] -= wuw[t][i] * c[t + i];
      }
    }
  }

  // Store generated parameters.
  {
    const double* c(&(cc[0]));
    int u(0);
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      double* C(&((*smoothed_static_parameters)[absolute_t][0]));
      if (is_continuous[absolute_t]) {
        for (int k(0); k < static_size; ++k) {
          C[k] = c[u++];
        }
      } else {
        for (int k(0); k < static_size; ++k) {
          C[k] = magic_number_;
        }
      }
    }
  }

  return true;
}